

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall
Clasp::UncoreMinimize::pushTrim(Clasp::Solver&)::Limit::propagateFixpoint(Clasp::Solver&,Clasp::
PostPropagator__(Limit *this,Solver *s,PostPropagator *ctx)

{
  _func_int **pp_Var1;
  Solver *in_RDX;
  long in_RSI;
  PostPropagator *in_RDI;
  bool local_1;
  
  if ((in_RDX == (Solver *)0x0) && (in_RDI[1].next <= *(PostPropagator **)(in_RSI + 0x30))) {
    Solver::setStopConflict(s);
    pp_Var1 = in_RDI[1].super_Constraint._vptr_Constraint;
    *(uint *)((long)pp_Var1 + 0xec) = *(uint *)((long)pp_Var1 + 0xec) & 0xefffffff | 0x10000000;
    in_RDI[1].super_Constraint._vptr_Constraint = (_func_int **)0x0;
    Solver::removePost(in_RDX,in_RDI);
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool propagateFixpoint(Clasp::Solver& s, Clasp::PostPropagator* ctx) {
				if (ctx || s.stats.conflicts < limit) { return true; }
				s.setStopConflict();
				self->next_ = 1;
				self = 0;
				s.removePost(this);
				return false;
			}